

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

const_iterator __thiscall
cppjieba::HMMSegment::SequentialLetterRule(HMMSegment *this,const_iterator begin,const_iterator end)

{
  uint uVar1;
  Rune x;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  
  uVar1 = begin->rune;
  if (((0x60 < uVar1) && (uVar1 < 0x7b)) ||
     ((this_local = (HMMSegment *)begin, 0x40 < uVar1 && (uVar1 < 0x5b)))) {
    for (end_local = begin + 1;
        (end_local != end &&
        (((uVar1 = end_local->rune, 0x60 < uVar1 && (uVar1 < 0x7b)) ||
         (((0x40 < uVar1 && (uVar1 < 0x5b)) || ((0x2f < uVar1 && (uVar1 < 0x3a))))))));
        end_local = end_local + 1) {
    }
    this_local = (HMMSegment *)end_local;
  }
  return (const_iterator)this_local;
}

Assistant:

RuneStrArray::const_iterator SequentialLetterRule(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    Rune x = begin->rune;
    if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z')) {
      begin ++;
    } else {
      return begin;
    }
    while (begin != end) {
      x = begin->rune;
      if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z') || ('0' <= x && x <= '9')) {
        begin ++;
      } else {
        break;
      }
    }
    return begin;
  }